

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_impl.h
# Opt level: O0

bool __thiscall
google::protobuf::internal::ThreadSafeArena::GetSerialArenaFast
          (ThreadSafeArena *this,SerialArena **arena)

{
  bool bVar1;
  ThreadCache *pTVar2;
  __pointer_type this_00;
  ThreadCache *pTVar3;
  SerialArena *serial;
  ThreadCache *tc;
  SerialArena **arena_local;
  ThreadSafeArena *this_local;
  
  bVar1 = GetSerialArenaFromThreadCache(this,arena);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    pTVar2 = thread_cache();
    this_00 = std::atomic<google::protobuf::internal::SerialArena_*>::load
                        ((atomic<google::protobuf::internal::SerialArena_*> *)(this + 0x18),
                         memory_order_acquire);
    bVar1 = false;
    if (this_00 != (__pointer_type)0x0) {
      pTVar3 = (ThreadCache *)SerialArena::owner(this_00);
      bVar1 = pTVar3 == pTVar2;
    }
    if (bVar1) {
      *arena = this_00;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

PROTOBUF_NDEBUG_INLINE bool GetSerialArenaFast(SerialArena** arena) {
    if (GetSerialArenaFromThreadCache(arena)) return true;

    // Check whether we own the last accessed SerialArena on this arena.  This
    // fast path optimizes the case where a single thread uses multiple arenas.
    ThreadCache* tc = &thread_cache();
    SerialArena* serial = hint_.load(std::memory_order_acquire);
    if (PROTOBUF_PREDICT_TRUE(serial != NULL && serial->owner() == tc)) {
      *arena = serial;
      return true;
    }
    return false;
  }